

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O3

float rsg::
      UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::InvSqrtOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::InvSqrtOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::InvSqrtOp>_>
      ::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar10;
  undefined1 auVar9 [16];
  float fVar11;
  undefined4 uVar12;
  float fVar13;
  
  fVar8 = 0.0;
  if ((valueRange.m_type)->m_baseType == TYPE_FLOAT) {
    iVar2 = state->m_shaderParams->maxExpressionDepth;
    iVar3 = state->m_expressionDepth;
    iVar4 = getConservativeValueExprDepth(state,valueRange);
    fVar8 = 0.0;
    if (iVar4 + 1 <= iVar2 - iVar3) {
      if ((valueRange.m_type)->m_numElements < 1) {
        fVar8 = 1.0;
      }
      else {
        fVar8 = 1.0;
        lVar5 = 0;
        do {
          VariableType::getElementType(valueRange.m_type);
          fVar7 = valueRange.m_min[lVar5].floatVal;
          VariableType::getElementType(valueRange.m_type);
          fVar13 = 1.0;
          if (-INFINITY < fVar7) {
            fVar1 = valueRange.m_max[lVar5].floatVal;
            fVar13 = 1.0;
            if (((fVar1 < INFINITY) && (fVar13 = 0.0, fVar7 <= 3.0)) && (0.4 <= fVar1)) {
              fVar13 = fVar7;
              if (fVar7 <= 0.4) {
                fVar13 = 0.4;
              }
              fVar11 = fVar1;
              if (3.0 <= fVar1) {
                fVar11 = 3.0;
              }
              fVar13 = (1.0 / fVar13) * (1.0 / fVar13);
              fVar11 = ceilf((1.0 / fVar11) * (1.0 / fVar11) * 8.0);
              fVar11 = fVar11 * 0.125;
              if (fVar11 <= fVar13) {
                fVar6 = floorf(fVar13 * 8.0);
                fVar6 = fVar6 * 0.125;
                fVar13 = 0.0;
                if (fVar11 <= fVar6) {
                  if ((fVar7 != fVar1) || (fVar13 = 1.0, NAN(fVar7) || NAN(fVar1))) {
                    if (fVar6 < 0.0) {
                      fVar6 = sqrtf(fVar6);
                      uVar12 = extraout_XMM0_Db;
                    }
                    else {
                      uVar12 = 0;
                      fVar6 = SQRT(fVar6);
                    }
                    if (fVar11 < 0.0) {
                      fVar11 = sqrtf(fVar11);
                      uVar10 = extraout_XMM0_Db_00;
                    }
                    else {
                      fVar11 = SQRT(fVar11);
                      uVar10 = 0;
                    }
                    auVar9._4_4_ = fVar11;
                    auVar9._0_4_ = fVar6;
                    auVar9._8_4_ = uVar12;
                    auVar9._12_4_ = uVar10;
                    auVar9 = divps(_DAT_01a25cf0,auVar9);
                    fVar7 = (auVar9._0_4_ - auVar9._4_4_) / (fVar1 - fVar7);
                    fVar13 = 0.1;
                    if (0.1 <= fVar7) {
                      fVar13 = fVar7;
                    }
                  }
                }
              }
              else {
                fVar13 = 0.0;
              }
            }
          }
          fVar8 = fVar8 * fVar13;
          lVar5 = lVar5 + 1;
        } while (lVar5 < (valueRange.m_type)->m_numElements);
      }
    }
  }
  return fVar8;
}

Assistant:

static inline void computeValueRange (float outMin, float outMax, float& inMin, float& inMax)
	{
		DE_VERIFY(C::transformValueRange(outMin, outMax, inMin, inMax));
		DE_VERIFY(quantizeFloatRange(inMin, inMax));
		DE_ASSERT(inMin <= inMax);
	}